

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# itrender.c
# Opt level: O0

void apply_pitch_modifications
               (DUMB_IT_SIGDATA *sigdata,IT_PLAYING *playing,double *delta,int *cutoff)

{
  float fVar1;
  uint uVar2;
  int iVar3;
  int *in_RCX;
  double *in_RDX;
  long in_RSI;
  long in_RDI;
  double dVar4;
  int p;
  double scale;
  int depth;
  int sample_vibrato_shift;
  int local_24;
  
  switch(*(undefined1 *)(in_RSI + 0x60)) {
  case 1:
    local_24 = (int)"@??>>==<<;;::99887766554433221100//..--,,++**))((\'\'&&%%$$##\"\"!!  \x1f\x1f\x1e\x1e\x1d\x1d\x1c\x1c\x1b\x1b\x1a\x1a\x19\x19\x18\x18\x17\x17\x16\x16\x15\x15\x14\x14\x13\x13\x12\x12\x11\x11\x10\x10\x0f\x0f\x0e\x0e\r\r\f\f\v\v\n\n\t\t\b\b\a\a\x06\x06\x05\x05\x04\x04\x03\x03\x02\x02\x01\x01"
                    [*(byte *)(in_RSI + 0x5f)];
    break;
  case 2:
    local_24 = (int)"@@@@@@@@@@@@@@@@@@@@@@@@@@@@@@@@@@@@@@@@@@@@@@@@@@@@@@@@@@@@@@@@@@@@@@@@@@@@@@@@@@@@@@@@@@@@@@@@@@@@@@@@@@@@@@@@@@@@@@@@@@@@@@@@"
                    [*(byte *)(in_RSI + 0x5f)];
    break;
  case 3:
    iVar3 = rand();
    local_24 = iVar3 % 0x81 + -0x40;
    break;
  case 4:
    local_24 = (int)it_xm_squarewave[*(byte *)(in_RSI + 0x5f)];
    break;
  case 5:
    local_24 = (int)""[*(byte *)(in_RSI + 0x5f)];
    break;
  case 6:
    local_24 = (int)""[(int)(0xff - (uint)*(byte *)(in_RSI + 0x5f))];
    break;
  default:
    local_24 = (int)""[*(byte *)(in_RSI + 0x5f)];
  }
  if ((*(uint *)(in_RDI + 100) & 0x40) == 0) {
    uVar2 = *(int *)(in_RSI + 100) >> 8;
  }
  else {
    uVar2 = (uint)*(byte *)(*(long *)(in_RSI + 0x10) + 0x51);
    if (*(char *)(*(long *)(in_RSI + 0x10) + 0x52) != '\0') {
      uVar2 = (int)(*(int *)(in_RSI + 100) * uVar2) /
              (int)(uint)*(byte *)(*(long *)(in_RSI + 0x10) + 0x52);
    }
  }
  local_24 = uVar2 * local_24;
  local_24 = local_24 >> 4;
  if (local_24 != 0) {
    if (((*(uint *)(in_RDI + 100) & 8) == 0) && ((*(uint *)(in_RDI + 100) & 0x40) != 0)) {
      dVar4 = *in_RDX;
      fVar1 = *(float *)(in_RSI + 0x6c);
      *in_RDX = (double)(1.5258789e-05 / *(float *)(in_RSI + 0x6c));
      *in_RDX = *in_RDX - (double)((float)local_24 / 5.675032e+07);
      if (*in_RDX <= 4.656754981624545e-10 && *in_RDX != 4.656754981624545e-10) {
        *in_RDX = 4.656754981624545e-10;
      }
      *in_RDX = (1.52587890625e-05 / *in_RDX) * (dVar4 / (double)fVar1);
    }
    else {
      dVar4 = pow(1.0002256593050698,(double)local_24);
      *in_RDX = (double)(float)dVar4 * *in_RDX;
    }
  }
  if ((*(long *)(in_RSI + 0x20) != 0) && ((*(byte *)(in_RSI + 0x4b) & 4) != 0)) {
    iVar3 = envelope_get_y((IT_ENVELOPE *)(*(long *)(in_RSI + 0x20) + 0xd4),
                           (IT_PLAYING_ENVELOPE *)(in_RSI + 0x8c));
    if ((*(byte *)(*(long *)(in_RSI + 0x20) + 0xd4) & 0x80) == 0) {
      dVar4 = pow(1.0002256593050698,(double)(iVar3 >> 1));
      *in_RDX = (double)(float)dVar4 * *in_RDX;
    }
    else {
      *in_RCX = *in_RCX * (iVar3 + 0x2000) >> 0xe;
    }
  }
  return;
}

Assistant:

static void apply_pitch_modifications(DUMB_IT_SIGDATA *sigdata, IT_PLAYING *playing, double *delta, int *cutoff)
{
	{
		int sample_vibrato_shift;
		switch (playing->sample_vibrato_waveform)
		{
		default:
			sample_vibrato_shift = it_sine[playing->sample_vibrato_time];
			break;
		case 1:
			sample_vibrato_shift = it_sawtooth[playing->sample_vibrato_time];
			break;
		case 2:
			sample_vibrato_shift = it_squarewave[playing->sample_vibrato_time];
			break;
		case 3:
			sample_vibrato_shift = (rand() % 129) - 64;
			break;
		case 4:
			sample_vibrato_shift = it_xm_squarewave[playing->sample_vibrato_time];
			break;
		case 5:
			sample_vibrato_shift = it_xm_ramp[playing->sample_vibrato_time];
			break;
		case 6:
			sample_vibrato_shift = it_xm_ramp[255-playing->sample_vibrato_time];
			break;
		}

		if (sigdata->flags & IT_WAS_AN_XM) {
			int depth = playing->sample->vibrato_depth; /* True depth */
			if (playing->sample->vibrato_rate) {
				depth *= playing->sample_vibrato_depth; /* Tick number */
				depth /= playing->sample->vibrato_rate; /* XM sweep */
			}
			sample_vibrato_shift *= depth;
		} else
			sample_vibrato_shift *= playing->sample_vibrato_depth >> 8;

		sample_vibrato_shift >>= 4;

		if (sample_vibrato_shift) {
			if ((sigdata->flags & IT_LINEAR_SLIDES) || !(sigdata->flags & IT_WAS_AN_XM))
				*delta *= (float)pow(DUMB_PITCH_BASE, sample_vibrato_shift);
			else {
				/* complicated! */
				double scale = *delta / playing->delta;

				*delta = (1.0f / 65536.0f) / playing->delta;

				*delta -= sample_vibrato_shift / AMIGA_DIVISOR;

				if (*delta < (1.0f / 65536.0f) / 32767.0f) {
					*delta = (1.0f / 65536.0f) / 32767.0f;
				}

				*delta = (1.0f / 65536.0f) / *delta * scale;
			}
		}
	}

	if (playing->env_instrument &&
		(playing->enabled_envelopes & IT_ENV_PITCH))
	{
		int p = envelope_get_y(&playing->env_instrument->pitch_envelope, &playing->pitch_envelope);
		if (playing->env_instrument->pitch_envelope.flags & IT_ENVELOPE_PITCH_IS_FILTER)
			*cutoff = (*cutoff * (p+(32<<IT_ENVELOPE_SHIFT))) >> (6 + IT_ENVELOPE_SHIFT);
		else
			*delta *= (float)pow(DUMB_PITCH_BASE, p >> (IT_ENVELOPE_SHIFT - 7));
	}
}